

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<ArgumentDef>::relocate
          (QArrayDataPointer<ArgumentDef> *this,qsizetype offset,ArgumentDef **data)

{
  ArgumentDef *d_first;
  ArgumentDef *pAVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<ArgumentDef,long_long>(this->ptr,this->size,d_first);
  if (data != (ArgumentDef **)0x0) {
    pAVar1 = *data;
    if ((this->ptr <= pAVar1) && (pAVar1 < this->ptr + this->size)) {
      *data = pAVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }